

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

void __thiscall
icu_63::PluralRuleParser::parse
          (PluralRuleParser *this,UnicodeString *ruleData,PluralRules *prules,UErrorCode *status)

{
  UnicodeString *src;
  short sVar1;
  tokenType tVar2;
  int8_t iVar3;
  UBool UVar4;
  int iVar5;
  int iVar6;
  UVector32 *pUVar7;
  OrConstraint *pOVar8;
  OrConstraint *pOVar9;
  AndConstraint *pAVar10;
  RuleChain *pRVar11;
  RuleChain *pRVar12;
  RuleChain **ppRVar13;
  int32_t iVar14;
  int iVar15;
  UErrorCode *size;
  UnicodeString *size_00;
  RuleChain *pRVar16;
  UErrorCode UVar17;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this->ruleSrc = ruleData;
    src = &this->token;
LAB_0026ca2e:
    do {
      sVar1 = (this->ruleSrc->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (this->ruleSrc->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      if (iVar5 <= this->ruleIndex) {
        return;
      }
      getNextToken(this,status);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      size = status;
      checkSyntax(this,status);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      switch(this->type) {
      case tNumber:
        pAVar10 = this->curAndConstraint;
        if ((pAVar10->op == MOD) && (pAVar10->opNum == -1)) {
          iVar14 = getNumberValue(src);
          this->curAndConstraint->opNum = iVar14;
        }
        else {
          pUVar7 = pAVar10->rangeList;
          if (pUVar7 == (UVector32 *)0x0) {
            iVar14 = getNumberValue(src);
            this->curAndConstraint->value = iVar14;
          }
          else {
            iVar5 = this->rangeLowIdx;
            if ((((long)iVar5 < 0) || (pUVar7->count <= iVar5)) || (pUVar7->elements[iVar5] != -1))
            {
              iVar14 = getNumberValue(src);
              UVector32::setElementAt(pUVar7,iVar14,this->rangeHiIdx);
              pUVar7 = this->curAndConstraint->rangeList;
              iVar5 = this->rangeLowIdx;
              iVar15 = 0;
              if ((-1 < (long)iVar5) && (iVar5 < pUVar7->count)) {
                iVar15 = pUVar7->elements[iVar5];
              }
              iVar5 = this->rangeHiIdx;
              iVar6 = 0;
              if ((-1 < (long)iVar5) && (iVar6 = 0, iVar5 < pUVar7->count)) {
                iVar6 = pUVar7->elements[iVar5];
              }
              if (iVar6 < iVar15) {
                UVar17 = U_FMT_PARSE_ERROR_START;
                goto LAB_0026d042;
              }
            }
            else {
              iVar14 = getNumberValue(src);
              UVector32::setElementAt(pUVar7,iVar14,this->rangeLowIdx);
              pUVar7 = this->curAndConstraint->rangeList;
              iVar14 = getNumberValue(src);
              UVector32::setElementAt(pUVar7,iVar14,this->rangeHiIdx);
            }
          }
        }
        break;
      case tComma:
        UVar17 = U_FMT_PARSE_ERROR_START;
        if ((this->curAndConstraint == (AndConstraint *)0x0) ||
           (pUVar7 = this->curAndConstraint->rangeList, pUVar7 == (UVector32 *)0x0))
        goto LAB_0026d042;
        iVar14 = pUVar7->count;
        this->rangeLowIdx = iVar14;
        if ((iVar14 < -1) || (pUVar7->capacity <= iVar14)) {
          UVar4 = UVector32::expandCapacity(pUVar7,iVar14 + 1,status);
          if (UVar4 != '\0') {
            iVar14 = pUVar7->count;
            goto LAB_0026cef8;
          }
        }
        else {
LAB_0026cef8:
          pUVar7->elements[iVar14] = -1;
          pUVar7->count = pUVar7->count + 1;
        }
        pUVar7 = this->curAndConstraint->rangeList;
        iVar5 = pUVar7->count;
        this->rangeHiIdx = iVar5;
        if ((iVar5 < -1) || (pUVar7->capacity <= iVar5)) {
          UVar4 = UVector32::expandCapacity(pUVar7,iVar5 + 1,status);
          if (UVar4 == '\0') break;
          iVar5 = pUVar7->count;
        }
        pUVar7->elements[iVar5] = -1;
        pUVar7->count = pUVar7->count + 1;
        break;
      default:
        this->prevType = this->type;
        goto LAB_0026ca2e;
      case tKeyword:
        pRVar11 = (RuleChain *)UMemory::operator_new((UMemory *)0xe0,(size_t)size);
        UVar17 = U_MEMORY_ALLOCATION_ERROR;
        if (pRVar11 == (RuleChain *)0x0) {
LAB_0026d042:
          *status = UVar17;
LAB_0026d045:
          this->prevType = this->type;
          return;
        }
        pRVar11->_vptr_RuleChain = (_func_int **)&PTR__RuleChain_003a9be8;
        (pRVar11->fKeyword).super_Replaceable.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UnicodeString_003b2258;
        (pRVar11->fKeyword).fUnion.fStackFields.fLengthAndFlags = 2;
        pRVar11->fNext = (RuleChain *)0x0;
        pRVar11->ruleHeader = (OrConstraint *)0x0;
        (pRVar11->fDecimalSamples).super_Replaceable.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UnicodeString_003b2258;
        (pRVar11->fDecimalSamples).fUnion.fStackFields.fLengthAndFlags = 2;
        (pRVar11->fIntegerSamples).super_Replaceable.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UnicodeString_003b2258;
        (pRVar11->fIntegerSamples).fUnion.fStackFields.fLengthAndFlags = 2;
        pRVar11->fDecimalSamplesUnbounded = '\0';
        pRVar11->fIntegerSamplesUnbounded = '\0';
        pRVar11->fInternalStatus = U_ZERO_ERROR;
        size_00 = src;
        UnicodeString::operator=(&pRVar11->fKeyword,src);
        pRVar12 = prules->mRules;
        ppRVar13 = &prules->mRules;
        if (pRVar12 != (RuleChain *)0x0) {
          pRVar16 = pRVar12->fNext;
          ppRVar13 = &pRVar12->fNext;
          if (pRVar16 == (RuleChain *)0x0) {
            pRVar12 = (RuleChain *)0x0;
          }
          else {
            do {
              sVar1 = (pRVar16->fKeyword).fUnion.fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar14 = (pRVar16->fKeyword).fUnion.fFields.fLength;
              }
              else {
                iVar14 = (int)sVar1 >> 5;
              }
              size_00 = (UnicodeString *)0x0;
              iVar3 = UnicodeString::doCompare
                                (&pRVar16->fKeyword,0,iVar14,(UChar *)PLURAL_KEYWORD_OTHER,0,5);
              pRVar12 = *ppRVar13;
              if (iVar3 == '\0') goto LAB_0026cf67;
              pRVar16 = pRVar12->fNext;
              ppRVar13 = &pRVar12->fNext;
            } while (pRVar16 != (RuleChain *)0x0);
            pRVar12 = (RuleChain *)0x0;
          }
LAB_0026cf67:
          pRVar11->fNext = pRVar12;
        }
        *ppRVar13 = pRVar11;
        pOVar9 = (OrConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)size_00);
        if (pOVar9 == (OrConstraint *)0x0) goto LAB_0026d042;
        *(undefined8 *)&pOVar9->fInternalStatus = 0;
        pOVar9->_vptr_OrConstraint = (_func_int **)&PTR__OrConstraint_003a9bc8;
        pOVar9->childNode = (AndConstraint *)0x0;
        pOVar9->next = (OrConstraint *)0x0;
        pOVar9->fInternalStatus = U_ZERO_ERROR;
        pRVar11->ruleHeader = pOVar9;
        pAVar10 = OrConstraint::add(pOVar9,status);
        this->curAndConstraint = pAVar10;
        this->currentChain = pRVar11;
        break;
      case tAnd:
        pAVar10 = AndConstraint::add(this->curAndConstraint,status);
        this->curAndConstraint = pAVar10;
        break;
      case tOr:
        pOVar9 = this->currentChain->ruleHeader;
        do {
          pOVar8 = pOVar9;
          pOVar9 = pOVar8->next;
        } while (pOVar8->next != (OrConstraint *)0x0);
        pOVar9 = (OrConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
        if (pOVar9 == (OrConstraint *)0x0) {
          pOVar8->next = (OrConstraint *)0x0;
          UVar17 = U_MEMORY_ALLOCATION_ERROR;
          goto LAB_0026d042;
        }
        *(undefined8 *)&pOVar9->fInternalStatus = 0;
        pOVar9->_vptr_OrConstraint = (_func_int **)&PTR__OrConstraint_003a9bc8;
        pOVar9->childNode = (AndConstraint *)0x0;
        pOVar9->next = (OrConstraint *)0x0;
        pOVar9->fInternalStatus = U_ZERO_ERROR;
        pOVar8->next = pOVar9;
        pOVar9->next = (OrConstraint *)0x0;
        pAVar10 = OrConstraint::add(pOVar9,status);
        this->curAndConstraint = pAVar10;
        break;
      case tMod:
        this->curAndConstraint->op = MOD;
        break;
      case tNot:
        this->curAndConstraint->negated = '\x01';
        break;
      case tIn:
      case tEqual:
      case tWithin:
        goto switchD_0026ca81_caseD_f;
      case tNotEqual:
        this->curAndConstraint->negated = '\x01';
switchD_0026ca81_caseD_f:
        pUVar7 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
        if (pUVar7 == (UVector32 *)0x0) {
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            *status = U_MEMORY_ALLOCATION_ERROR;
          }
        }
        else {
          UVector32::UVector32(pUVar7,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            this->curAndConstraint->rangeList = pUVar7;
            iVar5 = pUVar7->count;
            if ((iVar5 < -1) || (pUVar7->capacity <= iVar5)) {
              UVar4 = UVector32::expandCapacity(pUVar7,iVar5 + 1,status);
              if (UVar4 != '\0') {
                iVar5 = pUVar7->count;
                goto LAB_0026ce67;
              }
            }
            else {
LAB_0026ce67:
              pUVar7->elements[iVar5] = -1;
              pUVar7->count = pUVar7->count + 1;
            }
            pUVar7 = this->curAndConstraint->rangeList;
            iVar5 = pUVar7->count;
            if ((iVar5 < -1) || (pUVar7->capacity <= iVar5)) {
              UVar4 = UVector32::expandCapacity(pUVar7,iVar5 + 1,status);
              if (UVar4 != '\0') {
                iVar5 = pUVar7->count;
                goto LAB_0026cea1;
              }
            }
            else {
LAB_0026cea1:
              pUVar7->elements[iVar5] = -1;
              pUVar7->count = pUVar7->count + 1;
            }
            this->rangeLowIdx = 0;
            this->rangeHiIdx = 1;
            pAVar10 = this->curAndConstraint;
            pAVar10->value = 0x7fffffff;
            pAVar10->integerOnly = this->type != tWithin;
          }
          else {
            (*(pUVar7->super_UObject)._vptr_UObject[1])(pUVar7);
          }
        }
        break;
      case tVariableN:
      case tVariableI:
      case tVariableF:
      case tVariableV:
      case tVariableT:
        this->curAndConstraint->digitsType = this->type;
        break;
      case tDecimal:
        while( true ) {
          while( true ) {
            getNextToken(this,status);
            if (U_ZERO_ERROR < *status) goto LAB_0026d045;
            tVar2 = this->type;
            if ((int)tVar2 < 9) break;
            if (tVar2 != tEllipsis) {
              if (tVar2 != tEOF) goto LAB_0026cb05;
              goto LAB_0026cfd2;
            }
            this->currentChain->fDecimalSamplesUnbounded = '\x01';
          }
          if ((tVar2 == tSemiColon) || (tVar2 == tAt)) break;
LAB_0026cb05:
          sVar1 = (this->token).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar14 = (this->token).fUnion.fFields.fLength;
          }
          else {
            iVar14 = (int)sVar1 >> 5;
          }
          UnicodeString::doAppend(&this->currentChain->fDecimalSamples,src,0,iVar14);
        }
        break;
      case tInteger:
        while( true ) {
          while( true ) {
            getNextToken(this,status);
            if (U_ZERO_ERROR < *status) goto LAB_0026d045;
            tVar2 = this->type;
            if ((int)tVar2 < 9) break;
            if (tVar2 != tEllipsis) {
              if (tVar2 != tEOF) goto LAB_0026ca98;
              goto LAB_0026cfd2;
            }
            this->currentChain->fIntegerSamplesUnbounded = '\x01';
          }
          if ((tVar2 == tSemiColon) || (tVar2 == tAt)) break;
LAB_0026ca98:
          sVar1 = (this->token).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar14 = (this->token).fUnion.fFields.fLength;
          }
          else {
            iVar14 = (int)sVar1 >> 5;
          }
          UnicodeString::doAppend(&this->currentChain->fIntegerSamples,src,0,iVar14);
        }
      }
LAB_0026cfd2:
      UVar17 = *status;
      this->prevType = this->type;
    } while (UVar17 < U_ILLEGAL_ARGUMENT_ERROR);
  }
  return;
}

Assistant:

void
PluralRuleParser::parse(const UnicodeString& ruleData, PluralRules *prules, UErrorCode &status)
{
    if (U_FAILURE(status)) {
        return;
    }
    U_ASSERT(ruleIndex == 0);    // Parsers are good for a single use only!
    ruleSrc = &ruleData;

    while (ruleIndex< ruleSrc->length()) {
        getNextToken(status);
        if (U_FAILURE(status)) {
            return;
        }
        checkSyntax(status);
        if (U_FAILURE(status)) {
            return;
        }
        switch (type) {
        case tAnd:
            U_ASSERT(curAndConstraint != nullptr);
            curAndConstraint = curAndConstraint->add(status);
            break;
        case tOr:
            {
                U_ASSERT(currentChain != nullptr);
                OrConstraint *orNode=currentChain->ruleHeader;
                while (orNode->next != nullptr) {
                    orNode = orNode->next;
                }
                orNode->next= new OrConstraint();
                if (orNode->next == nullptr) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                orNode=orNode->next;
                orNode->next=nullptr;
                curAndConstraint = orNode->add(status);
            }
            break;
        case tIs:
            U_ASSERT(curAndConstraint != nullptr);
            U_ASSERT(curAndConstraint->value == -1);
            U_ASSERT(curAndConstraint->rangeList == nullptr);
            break;
        case tNot:
            U_ASSERT(curAndConstraint != nullptr);
            curAndConstraint->negated=TRUE;
            break;

        case tNotEqual:
            curAndConstraint->negated=TRUE;
            U_FALLTHROUGH;
        case tIn:
        case tWithin:
        case tEqual:
            {
                U_ASSERT(curAndConstraint != nullptr);
                LocalPointer<UVector32> newRangeList(new UVector32(status), status);
                if (U_FAILURE(status)) {
                    break;
                }
                curAndConstraint->rangeList = newRangeList.orphan();
                curAndConstraint->rangeList->addElement(-1, status);  // range Low
                curAndConstraint->rangeList->addElement(-1, status);  // range Hi
                rangeLowIdx = 0;
                rangeHiIdx  = 1;
                curAndConstraint->value=PLURAL_RANGE_HIGH;
                curAndConstraint->integerOnly = (type != tWithin);
            }
            break;
        case tNumber:
            U_ASSERT(curAndConstraint != nullptr);
            if ( (curAndConstraint->op==AndConstraint::MOD)&&
                 (curAndConstraint->opNum == -1 ) ) {
                curAndConstraint->opNum=getNumberValue(token);
            }
            else {
                if (curAndConstraint->rangeList == nullptr) {
                    // this is for an 'is' rule
                    curAndConstraint->value = getNumberValue(token);
                } else {
                    // this is for an 'in' or 'within' rule
                    if (curAndConstraint->rangeList->elementAti(rangeLowIdx) == -1) {
                        curAndConstraint->rangeList->setElementAt(getNumberValue(token), rangeLowIdx);
                        curAndConstraint->rangeList->setElementAt(getNumberValue(token), rangeHiIdx);
                    }
                    else {
                        curAndConstraint->rangeList->setElementAt(getNumberValue(token), rangeHiIdx);
                        if (curAndConstraint->rangeList->elementAti(rangeLowIdx) >
                                curAndConstraint->rangeList->elementAti(rangeHiIdx)) {
                            // Range Lower bound > Range Upper bound.
                            // U_UNEXPECTED_TOKEN seems a little funny, but it is consistently
                            // used for all plural rule parse errors.
                            status = U_UNEXPECTED_TOKEN;
                            break;
                        }
                    }
                }
            }
            break;
        case tComma:
            // TODO: rule syntax checking is inadequate, can happen with badly formed rules.
            //       Catch cases like "n mod 10, is 1" here instead.
            if (curAndConstraint == nullptr || curAndConstraint->rangeList == nullptr) {
                status = U_UNEXPECTED_TOKEN;
                break;
            }
            U_ASSERT(curAndConstraint->rangeList->size() >= 2);
            rangeLowIdx = curAndConstraint->rangeList->size();
            curAndConstraint->rangeList->addElement(-1, status);  // range Low
            rangeHiIdx = curAndConstraint->rangeList->size();
            curAndConstraint->rangeList->addElement(-1, status);  // range Hi
            break;
        case tMod:
            U_ASSERT(curAndConstraint != nullptr);
            curAndConstraint->op=AndConstraint::MOD;
            break;
        case tVariableN:
        case tVariableI:
        case tVariableF:
        case tVariableT:
        case tVariableV:
            U_ASSERT(curAndConstraint != nullptr);
            curAndConstraint->digitsType = type;
            break;
        case tKeyword:
            {
            RuleChain *newChain = new RuleChain;
            if (newChain == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }
            newChain->fKeyword = token;
            if (prules->mRules == nullptr) {
                prules->mRules = newChain;
            } else {
                // The new rule chain goes at the end of the linked list of rule chains,
                //   unless there is an "other" keyword & chain. "other" must remain last.
                RuleChain *insertAfter = prules->mRules;
                while (insertAfter->fNext!=nullptr &&
                       insertAfter->fNext->fKeyword.compare(PLURAL_KEYWORD_OTHER, 5) != 0 ){
                    insertAfter=insertAfter->fNext;
                }
                newChain->fNext = insertAfter->fNext;
                insertAfter->fNext = newChain;
            }
            OrConstraint *orNode = new OrConstraint();
            if (orNode == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }
            newChain->ruleHeader = orNode;
            curAndConstraint = orNode->add(status);
            currentChain = newChain;
            }
            break;

        case tInteger:
            for (;;) {
                getNextToken(status);
                if (U_FAILURE(status) || type == tSemiColon || type == tEOF || type == tAt) {
                    break;
                }
                if (type == tEllipsis) {
                    currentChain->fIntegerSamplesUnbounded = TRUE;
                    continue;
                }
                currentChain->fIntegerSamples.append(token);
            }
            break;

        case tDecimal:
            for (;;) {
                getNextToken(status);
                if (U_FAILURE(status) || type == tSemiColon || type == tEOF || type == tAt) {
                    break;
                }
                if (type == tEllipsis) {
                    currentChain->fDecimalSamplesUnbounded = TRUE;
                    continue;
                }
                currentChain->fDecimalSamples.append(token);
            }
            break;

        default:
            break;
        }
        prevType=type;
        if (U_FAILURE(status)) {
            break;
        }
    }
}